

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_object_physic::state_read
          (cse_alife_object_physic *this,xr_packet *packet,uint16_t size)

{
  uint16_t size_local;
  xr_packet *packet_local;
  cse_alife_object_physic *this_local;
  
  if (0xd < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
            super_cse_alife_object.super_cse_abstract.m_version) {
    if ((this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
        super_cse_alife_object.super_cse_abstract.m_version < 0x10) {
      cse_alife_dynamic_object::state_read((cse_alife_dynamic_object *)this,packet,size);
    }
    else {
      cse_alife_dynamic_object_visual::state_read
                (&this->super_cse_alife_dynamic_object_visual,packet,size);
    }
    if ((this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
        super_cse_alife_object.super_cse_abstract.m_version < 0x20) {
      cse_visual::visual_read
                (&(this->super_cse_alife_dynamic_object_visual).super_cse_visual,packet,
                 (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
                 super_cse_alife_object.super_cse_abstract.m_version);
    }
  }
  if (0x3f < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    cse_ph_skeleton::state_read(&this->super_cse_ph_skeleton,packet,size);
  }
  xr_packet::r_u32(packet,(uint32_t *)&(this->super_cse_ph_skeleton).field_0x2c);
  xr_packet::r_float(packet,&this->m_mass);
  if (9 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version) {
    xr_packet::r_sz(packet,&this->m_fixed_bones);
  }
  if ((0x1c < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
              super_cse_alife_object.super_cse_abstract.m_version) &&
     ((this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
      super_cse_alife_object.super_cse_abstract.m_version < 0x41)) {
    xr_packet::r_sz(packet,&(this->super_cse_alife_dynamic_object_visual).super_cse_visual.
                            m_startup_animation);
  }
  if ((this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
      super_cse_alife_object.super_cse_abstract.m_version < 0x40) {
    if (0x27 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_u8(packet,&(this->super_cse_ph_skeleton).m_flags);
    }
    if (0x38 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_u16(packet,&(this->super_cse_ph_skeleton).m_source_id);
    }
    if ((0x3c < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
                super_cse_alife_object.super_cse_abstract.m_version) &&
       (((this->super_cse_ph_skeleton).m_flags & 4) != 0)) {
      (*(this->super_cse_ph_skeleton)._vptr_cse_ph_skeleton[6])(&this->super_cse_ph_skeleton,packet)
      ;
    }
  }
  return;
}

Assistant:

void cse_alife_object_physic::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version >= CSE_VERSION_0x0e) {
		if (m_version < CSE_VERSION_0x10)
			cse_alife_dynamic_object::state_read(packet, size);
		else
			cse_alife_dynamic_object_visual::state_read(packet, size);
		if (m_version < CSE_VERSION_0x20)
			cse_visual::visual_read(packet, m_version);
	}
	if (m_version >= CSE_VERSION_0x40)
		cse_ph_skeleton::state_read(packet, size);
	packet.r_u32(m_type);
	packet.r_float(m_mass);
	if (m_version > CSE_VERSION_0x09)
		packet.r_sz(m_fixed_bones);
	if (m_version > CSE_VERSION_0x1c && m_version < CSE_VERSION_0x41)
		packet.r_sz(cse_visual::m_startup_animation);
	if (m_version < CSE_VERSION_0x40) {
		if (m_version > CSE_VERSION_0x27)
			packet.r_u8(cse_ph_skeleton::m_flags);
		if (m_version > CSE_VERSION_0x38)
			packet.r_u16(cse_ph_skeleton::m_source_id);
		if ((m_version > CSE_VERSION_0x3c) && (cse_ph_skeleton::m_flags & FL_SAVED_DATA) != 0)
			data_load(packet);
	}
}